

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryBasicGeometryShaderTests.cpp
# Opt level: O0

TestInstance * __thiscall
vkt::geometry::anon_unknown_0::BuiltinVariableRenderTest::createInstance
          (BuiltinVariableRenderTest *this,Context *context)

{
  VkBool32 VVar1;
  InstanceInterface *vki;
  VkPhysicalDevice physDevice;
  NotSupportedError *this_00;
  BuiltinVariableRenderTestInstance *this_01;
  char *name;
  Context *context_local;
  BuiltinVariableRenderTest *this_local;
  
  if (this->m_test == TEST_POINT_SIZE) {
    vki = Context::getInstanceInterface(context);
    physDevice = Context::getPhysicalDevice(context);
    VVar1 = checkPointSize(vki,physDevice);
    if (VVar1 == 0) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,"Missing feature: pointSize",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/geometry/vktGeometryBasicGeometryShaderTests.cpp"
                 ,0x45d);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  this_01 = (BuiltinVariableRenderTestInstance *)operator_new(0xc0);
  name = tcu::TestNode::getName((TestNode *)this);
  BuiltinVariableRenderTestInstance::BuiltinVariableRenderTestInstance
            (this_01,context,name,this->m_test,(bool)(this->m_flag & 1));
  return (TestInstance *)this_01;
}

Assistant:

TestInstance* BuiltinVariableRenderTest::createInstance (Context& context) const
{
	if (m_test == TEST_POINT_SIZE && !checkPointSize(context.getInstanceInterface(), context.getPhysicalDevice()))
			TCU_THROW(NotSupportedError, "Missing feature: pointSize");
	return new BuiltinVariableRenderTestInstance(context, getName(), m_test, m_flag);
}